

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::SpotLightSource::writeTo(SpotLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::writeRaw(binary,&this->from,0xc);
  BinaryWriter::writeRaw(binary,&this->to,0xc);
  BinaryWriter::writeRaw(binary,&this->I,0xc);
  (*(this->Ispectrum).super_Entity._vptr_Entity[1])(&this->Ispectrum,binary);
  BinaryWriter::writeRaw(binary,&this->coneAngle,4);
  BinaryWriter::writeRaw(binary,&this->coneDeltaAngle,4);
  BinaryWriter::writeRaw(binary,&this->scale,0xc);
  return 0x47;
}

Assistant:

int SpotLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(coneAngle);
    binary.write(coneDeltaAngle);
    binary.write(scale);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }